

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

void __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
          (RayTracingPipelineStateCreateInfoX *this,RayTracingPipelineStateCreateInfoX *param_1)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ,&param_1->
               super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
            );
  pRVar1 = (param_1->GeneralShaders).
           super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->GeneralShaders).
       super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->GeneralShaders).
       super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (param_1->TriangleHitShaders).
           super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->TriangleHitShaders).
       super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->TriangleHitShaders).
       super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar3 = (param_1->ProceduralHitShaders).
           super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->ProceduralHitShaders).
       super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ProceduralHitShaders).
       super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (param_1->ShaderObjects).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->ShaderObjects).
       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ShaderObjects).
       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

RayTracingPipelineStateCreateInfoX(RayTracingPipelineStateCreateInfoX&&) noexcept = default;